

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

void copysymbol(MOJOSHADER_symbol *dst,MOJOSHADER_symbol *src,MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  size_t sVar2;
  char *__dest;
  
  sVar2 = strlen(src->name);
  __dest = (char *)(*m)((int)sVar2 + 1,d);
  strcpy(__dest,src->name);
  dst->name = __dest;
  uVar1 = src->register_index;
  dst->register_set = src->register_set;
  dst->register_index = uVar1;
  dst->register_count = src->register_count;
  copysymbolinfo(&dst->info,&src->info,m,d);
  return;
}

Assistant:

void copysymbol(MOJOSHADER_symbol *dst,
                MOJOSHADER_symbol *src,
                MOJOSHADER_malloc m,
                void *d)
{
    uint32 siz = strlen(src->name) + 1;
    char *stringcopy = (char *) m(siz, d);
    // !!! FIXME: Out of memory check!
    strcpy(stringcopy, src->name);
    dst->name = stringcopy;
    dst->register_set = src->register_set;
    dst->register_index = src->register_index;
    dst->register_count = src->register_count;
    copysymbolinfo(&dst->info, &src->info, m, d);
}